

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroIO.cpp
# Opt level: O1

void __thiscall OpenMD::HydroIO::openWriter(HydroIO *this,ostream *os)

{
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *this_00;
  long *str;
  OStreamWrapper *pOVar1;
  size_t sVar2;
  string h;
  long *local_38 [2];
  long local_28 [2];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"OpenMD-Hydro","");
  pOVar1 = (OStreamWrapper *)operator_new(8);
  pOVar1->stream_ = os;
  this->osw_ = pOVar1;
  this_00 = &this->w_;
  (this->w_).
  super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  .os_ = pOVar1;
  *(undefined2 *)
   &(this->w_).
    super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    .hasRoot_ = 0x2000;
  (this->w_).
  super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  .level_stack_.stackTop_ =
       (this->w_).
       super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
       .level_stack_.stack_;
  this->writerOpen_ = true;
  (this->w_).
  super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  .maxDecimalPlaces_ = 7;
  (this->w_).indentCharCount_ = 2;
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(this_00);
  str = local_38[0];
  sVar2 = strlen((char *)local_38[0]);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(this_00,(Ch *)str,(SizeType)sVar2,false);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(this_00);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void HydroIO::openWriter(std::ostream& os) {
    std::string h = "OpenMD-Hydro";
#if defined(NLOHMANN_JSON)
    j_[h]       = ordered_json::array();
    writerOpen_ = true;
#elif defined(RAPID_JSON)
    osw_ = new OStreamWrapper(os);
    w_.Reset(*osw_);
    writerOpen_ = true;

    w_.SetMaxDecimalPlaces(7);
    w_.SetIndent(' ', 2);

    w_.StartObject();
    w_.Key(h.c_str());
    w_.StartArray();
#endif
  }